

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPController.cpp
# Opt level: O3

ssize_t __thiscall
TCPController::recv(TCPController *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ushort uVar1;
  TCPConnection *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  Ethernet *pEVar2;
  int iVar3;
  ssize_t sVar4;
  mapped_type *pmVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  ostream *poVar8;
  undefined4 extraout_var;
  ssize_t extraout_RAX;
  int fd;
  uint8_t *data;
  mapped_type local_38;
  ushort local_32;
  Ethernet *local_30;
  uint local_24;
  NetworkDevice *local_20;
  
  sVar4 = IPController::recv((IPController *)&local_30,(int)this->ip_ctrl,__buf,__n,__flags);
  pEVar2 = local_30;
  if ((local_30 != (Ethernet *)0x0) && (local_20 != (NetworkDevice *)0x0)) {
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
    uVar1 = *(ushort *)((long)&pEVar2->_vptr_Ethernet + 2);
    local_32 = uVar1 << 8 | uVar1 >> 8;
    pmVar5 = std::__detail::
             _Map_base<unsigned_short,_std::pair<const_unsigned_short,_int>,_std::allocator<std::pair<const_unsigned_short,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_int>,_std::allocator<std::pair<const_unsigned_short,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->port_fd_map,&local_32);
    local_38 = *pmVar5;
    iVar6 = std::
            _Hashtable<int,_std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->connections)._M_h,&local_38);
    if (iVar6.
        super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_false>.
        _M_cur == (__node_type *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"not found port",0xe)
      ;
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      TCPConnection::recv(&this->dummy_connection,(int)local_30,local_20,(ulong)local_24,__flags);
      iVar3 = pthread_rwlock_unlock((pthread_rwlock_t *)this);
      sVar4 = CONCAT44(extraout_var,iVar3);
    }
    else {
      pmVar7 = std::__detail::
               _Map_base<int,_std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->connections,&local_38);
      this_00 = (pmVar7->super___shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_01 = (pmVar7->super___shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                _M_pi;
      if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        pthread_rwlock_unlock((pthread_rwlock_t *)this);
        sVar4 = TCPConnection::recv(this_00,(int)local_30,local_20,(ulong)local_24,__flags);
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
        pthread_rwlock_unlock((pthread_rwlock_t *)this);
        TCPConnection::recv(this_00,(int)local_30,local_20,(ulong)local_24,__flags);
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        sVar4 = extraout_RAX;
      }
    }
  }
  return sVar4;
}

Assistant:

void TCPController::recv() {
    auto[data, protocol, from_ip, size] = ip_ctrl.recv();
    if (data != nullptr && size != 0) {
        auto *tcp = (tcp_t *) data;
        std::shared_lock lck(mutex_);
        int fd = port_fd_map[ntohs(tcp->dst_port)];
        if (connections.find(fd) != connections.end()) {
            auto conn = connections[fd];
            lck.unlock();
            conn->recv(data, size, from_ip);
        } else {
            std::cout << "not found port" << ntohs(tcp->dst_port) << std::endl;
            dummy_connection.recv(data, size, from_ip);
        }
    }
}